

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O0

bool __thiscall
ruckig::Profile::
check_for_second_order_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double aUp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  reference pvVar6;
  reference pvVar7;
  array<double,_8UL> *this_00;
  double extraout_XMM0_Qa;
  double local_f8;
  ulong local_d8;
  size_t i;
  double local_c8;
  double local_98;
  undefined1 local_90 [56];
  undefined8 local_58;
  value_type_conflict2 local_50;
  value_type_conflict2 local_48;
  value_type_conflict2 local_40;
  value_type_conflict2 local_38;
  value_type_conflict2 local_30;
  value_type_conflict2 local_28;
  double local_20;
  double aUp_local;
  Profile *this_local;
  
  local_20 = aUp;
  aUp_local = (double)this;
  pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
  if (0.0 < *pvVar6 || *pvVar6 == 0.0) {
    local_58 = 0;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
    local_50 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
    local_48 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
    local_40 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
    local_38 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
    local_30 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
    local_28 = *pvVar6;
    memcpy(&this->t_sum,&local_58,0x38);
    pvVar6 = std::array<double,_7UL>::back(&this->t_sum);
    if (*pvVar6 <= 1000000000000.0) {
      memset(local_90,0,0x38);
      memcpy(local_90,&DAT_00161538,0x38);
      memcpy(&this->j,local_90,0x38);
      memset(&i,0,0x40);
      pvVar6 = std::array<double,_7UL>::operator[](&this->t,1);
      if (*pvVar6 <= 0.0) {
        local_f8 = 0.0;
      }
      else {
        local_f8 = local_20;
      }
      local_c8 = local_f8;
      local_98 = this->af;
      memcpy(&this->a,&i,0x40);
      for (local_d8 = 0; local_d8 < 7; local_d8 = local_d8 + 1) {
        pvVar7 = std::array<double,_8UL>::operator[](&this->v,local_d8);
        dVar1 = *pvVar7;
        pvVar6 = std::array<double,_7UL>::operator[](&this->t,local_d8);
        dVar2 = *pvVar6;
        pvVar7 = std::array<double,_8UL>::operator[](&this->a,local_d8);
        dVar3 = *pvVar7;
        pvVar7 = std::array<double,_8UL>::operator[](&this->v,local_d8 + 1);
        *pvVar7 = dVar2 * dVar3 + dVar1;
        pvVar7 = std::array<double,_8UL>::operator[](&this->p,local_d8);
        dVar1 = *pvVar7;
        pvVar6 = std::array<double,_7UL>::operator[](&this->t,local_d8);
        dVar2 = *pvVar6;
        pvVar7 = std::array<double,_8UL>::operator[](&this->v,local_d8);
        dVar3 = *pvVar7;
        pvVar6 = std::array<double,_7UL>::operator[](&this->t,local_d8);
        dVar4 = *pvVar6;
        pvVar7 = std::array<double,_8UL>::operator[](&this->a,local_d8);
        dVar5 = *pvVar7;
        pvVar7 = std::array<double,_8UL>::operator[](&this->p,local_d8 + 1);
        *pvVar7 = dVar2 * (dVar3 + (dVar4 * dVar5) / 2.0) + dVar1;
      }
      this->control_signs = UDUD;
      this->limits = NONE;
      this->direction = (uint)(local_20 <= 0.0);
      this_00 = &this->v;
      std::array<double,_8UL>::back(this_00);
      std::abs((int)this_00);
      this_local._7_1_ = extraout_XMM0_Qa < 1e-08;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check_for_second_order_velocity(double aUp) {
        // ReachedLimits::ACC0
        if (t[1] < 0.0) {
            return false;
        }

        t_sum = {0, t[1], t[1], t[1], t[1], t[1], t[1]};
        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        j = {0, 0, 0, 0, 0, 0, 0};
        a = {0, (t[1] > 0) ? aUp : 0, 0, 0, 0, 0, 0, af};
        for (size_t i = 0; i < 7; ++i) {
            v[i+1] = v[i] + t[i] * a[i];
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * a[i] / 2);
        }

        this->control_signs = control_signs;
        this->limits = limits;

        direction = (aUp > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(15) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(v.back() - vf) < v_precision;
    }